

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr
xmlLoadResource(xmlParserCtxtPtr ctxt,char *url,char *publicId,xmlResourceType type)

{
  int code_00;
  xmlChar *pxVar1;
  uint local_4c;
  int code;
  int flags;
  char *resource;
  xmlParserInputPtr ret;
  char *canonicFilename;
  char *pcStack_28;
  xmlResourceType type_local;
  char *publicId_local;
  char *url_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (url == (char *)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    canonicFilename._4_4_ = type;
    pcStack_28 = publicId;
    publicId_local = url;
    url_local = (char *)ctxt;
    if ((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->resourceLoader == (xmlResourceLoader)0x0)) {
      ret = (xmlParserInputPtr)xmlCanonicPath((xmlChar *)url);
      if (ret == (xmlParserInputPtr)0x0) {
        xmlCtxtErrMemory((xmlParserCtxtPtr)url_local);
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else {
        resource = (char *)(*xmlCurrentExternalEntityLoader)
                                     ((char *)ret,pcStack_28,(xmlParserCtxtPtr)url_local);
        (*xmlFree)(ret);
        ctxt_local = (xmlParserCtxtPtr)resource;
      }
    }
    else {
      local_4c = 0;
      pxVar1 = xmlResolveResourceFromCatalog(url,publicId,ctxt);
      if (pxVar1 != (xmlChar *)0x0) {
        publicId_local = (char *)pxVar1;
      }
      if ((*(uint *)(url_local + 0x234) & 0x1000000) != 0) {
        local_4c = 8;
      }
      if ((*(uint *)(url_local + 0x234) & 0x800) == 0) {
        local_4c = local_4c | 0x10;
      }
      code_00 = (**(code **)(url_local + 0x328))
                          (*(undefined8 *)(url_local + 0x330),publicId_local,pcStack_28,
                           canonicFilename._4_4_,local_4c,&resource);
      if (code_00 != 0) {
        xmlCtxtErrIO((xmlParserCtxtPtr)url_local,code_00,publicId_local);
        resource = (char *)0x0;
      }
      if (pxVar1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar1);
      }
      ctxt_local = (xmlParserCtxtPtr)resource;
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlLoadResource(xmlParserCtxtPtr ctxt, const char *url, const char *publicId,
                xmlResourceType type) {
    char *canonicFilename;
    xmlParserInputPtr ret;

    if (url == NULL)
        return(NULL);

    if ((ctxt != NULL) && (ctxt->resourceLoader != NULL)) {
        char *resource = NULL;
        int flags = 0;
        int code;

#ifdef LIBXML_CATALOG_ENABLED
        resource = (char *) xmlResolveResourceFromCatalog(url, publicId, ctxt);
        if (resource != NULL)
            url = resource;
#endif

        if (ctxt->options & XML_PARSE_UNZIP)
            flags |= XML_INPUT_UNZIP;
        if ((ctxt->options & XML_PARSE_NONET) == 0)
            flags |= XML_INPUT_NETWORK;

        code = ctxt->resourceLoader(ctxt->resourceCtxt, url, publicId, type,
                                    flags, &ret);
        if (code != XML_ERR_OK) {
            xmlCtxtErrIO(ctxt, code, url);
            ret = NULL;
        }
        if (resource != NULL)
            xmlFree(resource);
        return(ret);
    }

    canonicFilename = (char *) xmlCanonicPath((const xmlChar *) url);
    if (canonicFilename == NULL) {
        xmlCtxtErrMemory(ctxt);
        return(NULL);
    }

    ret = xmlCurrentExternalEntityLoader(canonicFilename, publicId, ctxt);
    xmlFree(canonicFilename);
    return(ret);
}